

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testoverlay2.c
# Opt level: O1

void ConvertRGBtoYV12(SDL_Surface *s,SDL_Overlay *o,int monochrome,int luminance)

{
  ushort *puVar1;
  Uint8 **ppUVar2;
  Uint8 *pUVar3;
  uint uVar4;
  Uint8 *rgb;
  long lVar5;
  Uint8 *pUVar6;
  int yuv [3];
  Uint8 local_44 [4];
  Uint8 local_40;
  Uint8 local_3c;
  Uint8 *local_38;
  
  SDL_LockSurface();
  SDL_LockYUVOverlay(o);
  if (0 < s->h) {
    uVar4 = 0;
    do {
      if (o->h <= (int)uVar4) break;
      if (0 < s->w) {
        puVar1 = o->pitches;
        ppUVar2 = o->pixels;
        pUVar3 = ppUVar2[2] + (uint)puVar1[2] * (uVar4 >> 1);
        pUVar6 = ppUVar2[1] + (uint)puVar1[1] * (uVar4 >> 1);
        rgb = (Uint8 *)((ulong)(s->pitch * uVar4) + (long)s->pixels);
        local_38 = *ppUVar2 + *puVar1 * uVar4;
        lVar5 = 0;
        do {
          if (o->w <= (int)(uint)lVar5) break;
          RGBtoYUV(rgb,(int *)local_44,monochrome,luminance);
          local_38[lVar5] = local_44[0];
          if ((((uint)lVar5 | uVar4) & 1) == 0) {
            *pUVar6 = local_3c;
            pUVar6 = pUVar6 + 1;
            *pUVar3 = local_40;
            pUVar3 = pUVar3 + 1;
          }
          rgb = rgb + s->format->BytesPerPixel;
          lVar5 = lVar5 + 1;
        } while ((int)lVar5 < s->w);
      }
      uVar4 = uVar4 + 1;
    } while ((int)uVar4 < s->h);
  }
  SDL_UnlockYUVOverlay(o);
  SDL_UnlockSurface(s);
  return;
}

Assistant:

void ConvertRGBtoYV12(SDL_Surface *s, SDL_Overlay *o, int monochrome, int luminance)
{
	int x,y;
	int yuv[3];
	Uint8 *p,*op[3];

	SDL_LockSurface(s);
	SDL_LockYUVOverlay(o);

	/* Convert */
	for(y=0; y<s->h && y<o->h; y++)
	{
		p=((Uint8 *) s->pixels)+s->pitch*y;
		op[0]=o->pixels[0]+o->pitches[0]*y;
		op[1]=o->pixels[1]+o->pitches[1]*(y/2);
		op[2]=o->pixels[2]+o->pitches[2]*(y/2);
		for(x=0; x<s->w && x<o->w; x++)
		{
			RGBtoYUV(p, yuv, monochrome, luminance);
			*(op[0]++)=yuv[0];
			if(x%2==0 && y%2==0)
			{
				*(op[1]++)=yuv[2];
				*(op[2]++)=yuv[1];
			}
			p+=s->format->BytesPerPixel;
		}
	}

	SDL_UnlockYUVOverlay(o);
	SDL_UnlockSurface(s);
}